

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

enum_<ImPlotAxisFlags_> * __thiscall
pybind11::enum_<ImPlotAxisFlags_>::value
          (enum_<ImPlotAxisFlags_> *this,char *name,ImPlotAxisFlags_ value,char *doc)

{
  object local_30;
  ImPlotAxisFlags_ value_local;
  
  value_local = value;
  local_30.super_handle =
       detail::type_caster_base<ImPlotAxisFlags_>::cast(&value_local,copy,(handle)0x0);
  detail::enum_base::value(&this->m_base,name,&local_30,doc);
  object::~object(&local_30);
  return this;
}

Assistant:

enum_& value(char const* name, Type value, const char *doc = nullptr) {
        m_base.value(name, pybind11::cast(value, return_value_policy::copy), doc);
        return *this;
    }